

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gwham.hpp
# Opt level: O0

void __thiscall
WHAM<std::shared_ptr<Ensemble>,_gnarray<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_unsigned_long,_double>,_gnarray<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_double,_double>_>
::printfree(WHAM<std::shared_ptr<Ensemble>,_gnarray<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_unsigned_long,_double>,_gnarray<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_double,_double>_>
            *this)

{
  ulong uVar1;
  size_type sVar2;
  const_reference pvVar3;
  type this_00;
  double local_20;
  uint local_14;
  WHAM<std::shared_ptr<Ensemble>,_gnarray<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_unsigned_long,_double>,_gnarray<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_double,_double>_>
  *pWStack_10;
  uint i;
  WHAM<std::shared_ptr<Ensemble>,_gnarray<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_unsigned_long,_double>,_gnarray<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_double,_double>_>
  *this_local;
  
  pWStack_10 = this;
  printf("#%10s%30s\n","State","DimensionlessFreeEnergy");
  local_14 = 0;
  while( true ) {
    uVar1 = (ulong)local_14;
    sVar2 = std::vector<double,_std::allocator<double>_>::size(&this->expf);
    if (sVar2 <= uVar1) break;
    std::operator<<((ostream *)&std::cout,"#");
    FormatStream<std::basic_ostream<char,_std::char_traits<char>_>_>::width(&fcout,10);
    FormatStream<std::ostream>::operator<<((FormatStream<std::ostream> *)&fcout,&local_14);
    FormatStream<std::basic_ostream<char,_std::char_traits<char>_>_>::width(&fcout,0x1e);
    FormatStream<std::basic_ostream<char,_std::char_traits<char>_>_>::precision(&fcout,0xf);
    pvVar3 = std::vector<double,_std::allocator<double>_>::operator[](&this->expf,(ulong)local_14);
    local_20 = log(*pvVar3);
    this_00 = FormatStream<std::ostream>::operator<<((FormatStream<std::ostream> *)&fcout,&local_20)
    ;
    FormatStream<std::basic_ostream<char,_std::char_traits<char>_>_>::operator<<
              (this_00,std::endl<char,std::char_traits<char>>);
    local_14 = local_14 + 1;
  }
  return;
}

Assistant:

void WHAM<PENSEMBLE,HISTOGRAM,NARRAY>::printfree() const {
  printf("#%10s%30s\n","State","DimensionlessFreeEnergy");
  for(uint i = 0; i < expf.size(); ++i) {
    cout << "#";
    fcout.width(10);
    fcout << i;
    fcout.width(30);
    fcout.precision(15);
    fcout << log(expf[i]) << endl;
  }
}